

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall NullType::serialise(NullType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  size_t max_len_local;
  uint8_t *buf_local;
  NullType *this_local;
  
  iVar1 = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,0);
  return iVar1;
}

Assistant:

int NullType::serialise(uint8_t* buf, size_t max_len){
    return BER_CONTAINER::serialise(buf, max_len, 0);
}